

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::State::State(State *this,int32_t hiddenSize,int32_t outputSize,int32_t seed)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined4 *__s;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  this_00 = (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)(in_RDI + 4);
  Vector::Vector((Vector *)CONCAT44(in_ESI,in_EDX),CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  Vector::Vector((Vector *)CONCAT44(in_ESI,in_EDX),CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  __s = in_RDI + 0x10;
  Vector::Vector((Vector *)CONCAT44(in_ESI,in_EDX),CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine(this_00,(result_type)__s);
  return;
}

Assistant:

Model::State::State(int32_t hiddenSize, int32_t outputSize, int32_t seed)
    : lossValue_(0.0),
      nexamples_(0),
      hidden(hiddenSize),
      output(outputSize),
      grad(hiddenSize),
      rng(seed) {}